

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O2

void __thiscall
pstore::command_line::word_wrapper::word_wrapper
          (word_wrapper *this,string *text,size_t max_width,size_t pos)

{
  this->text_ = text;
  this->max_width_ = max_width;
  this->start_pos_ = pos;
  (this->substr_)._M_dataplus._M_p = (pointer)&(this->substr_).field_2;
  (this->substr_)._M_string_length = 0;
  (this->substr_).field_2._M_local_buf[0] = '\0';
  next(this);
  return;
}

Assistant:

word_wrapper::word_wrapper (std::string const & text, std::size_t const max_width,
                                        std::size_t const pos)
                    : text_{text}
                    , max_width_{max_width}
                    , start_pos_{pos} {
                this->next ();
            }